

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

void xmlLoadCatalogs(char *pathss)

{
  byte *pbVar1;
  byte bVar2;
  xmlChar *filename;
  long lVar3;
  
  if (pathss != (char *)0x0) {
    bVar2 = *pathss;
    while (bVar2 != 0) {
      while (bVar2 < 0x21) {
        if ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0) {
          if ((ulong)bVar2 == 0) goto LAB_0013bc84;
          break;
        }
        pbVar1 = (xmlChar *)pathss + 1;
        pathss = (char *)((xmlChar *)pathss + 1);
        bVar2 = *pbVar1;
      }
      lVar3 = 0;
      while ((0x3a < bVar2 || ((0x400000100002601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
        bVar2 = ((xmlChar *)pathss)[lVar3 + 1];
        lVar3 = lVar3 + 1;
      }
      filename = xmlStrndup((xmlChar *)pathss,(int)lVar3);
      pathss = (char *)((xmlChar *)pathss + lVar3);
      if (filename != (xmlChar *)0x0) {
        xmlLoadCatalog((char *)filename);
        (*xmlFree)(filename);
      }
LAB_0013bc84:
      pathss = (char *)((xmlChar *)pathss + -1);
      do {
        bVar2 = ((xmlChar *)pathss)[1];
        pathss = (char *)((xmlChar *)pathss + 1);
      } while (bVar2 == 0x3a);
    }
  }
  return;
}

Assistant:

void
xmlLoadCatalogs(const char *pathss) {
    const char *cur;
    const char *paths;
    xmlChar *path;
#ifdef _WIN32
    int i, iLen;
#endif

    if (pathss == NULL)
	return;

    cur = pathss;
    while (*cur != 0) {
	while (xmlIsBlank_ch(*cur)) cur++;
	if (*cur != 0) {
	    paths = cur;
	    while ((*cur != 0) && (*cur != PATH_SEPARATOR) && (!xmlIsBlank_ch(*cur)))
		cur++;
	    path = xmlStrndup((const xmlChar *)paths, cur - paths);
	    if (path != NULL) {
#ifdef _WIN32
        iLen = strlen((const char*)path);
        for(i = 0; i < iLen; i++) {
            if(path[i] == '\\') {
                path[i] = '/';
            }
        }
#endif
		xmlLoadCatalog((const char *) path);
		xmlFree(path);
	    }
	}
	while (*cur == PATH_SEPARATOR)
	    cur++;
    }
}